

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::FunctionBody::CheckAndRegisterFuncToDiag(FunctionBody *this,ScriptContext *scriptContext)

{
  bool bVar1;
  DWORD_PTR DVar2;
  DebugContext *pDVar3;
  ProbeContainer *pPVar4;
  FunctionBody *this_00;
  ArenaAllocator *alloc;
  OutOfMemoryException anon_var_0;
  FunctionBody *pFunc;
  ScriptContext *scriptContext_local;
  FunctionBody *this_local;
  
  DVar2 = FunctionProxy::GetHostSourceContext((FunctionProxy *)this);
  if ((DVar2 == 0xffffffffffffffff) && ((*(uint *)&this->field_0x178 >> 4 & 1) == 0)) {
    pDVar3 = ScriptContext::GetDebugContext(scriptContext);
    pPVar4 = DebugContext::GetProbeContainer(pDVar3);
    DVar2 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)this);
    bVar1 = Js::ProbeContainer::IsContextRegistered(pPVar4,DVar2);
    if (!bVar1) {
      pDVar3 = ScriptContext::GetDebugContext(scriptContext);
      pPVar4 = DebugContext::GetProbeContainer(pDVar3);
      DVar2 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)this);
      this_00 = Js::ProbeContainer::GetGlobalFunc(pPVar4,scriptContext,DVar2);
      if (this_00 == (FunctionBody *)0x0) {
        return;
      }
      ParseableFunctionInfo::RegisterFuncToDiag
                (&this_00->super_ParseableFunctionInfo,scriptContext,L"eval code");
      pDVar3 = ScriptContext::GetDebugContext(scriptContext);
      pPVar4 = DebugContext::GetProbeContainer(pDVar3);
      DVar2 = FunctionProxy::GetSecondaryHostSourceContext((FunctionProxy *)this);
      alloc = ScriptContext::AllocatorForDiagnostics(scriptContext);
      Js::ProbeContainer::RegisterContextToDiag(pPVar4,DVar2,alloc);
      *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffffef | 0x10;
      return;
    }
  }
  *(uint *)&this->field_0x178 = *(uint *)&this->field_0x178 & 0xffffffef | 0x10;
  return;
}

Assistant:

void FunctionBody::CheckAndRegisterFuncToDiag(ScriptContext *scriptContext)
    {
        // We will register function if, this is not host managed and it was not registered before.
        if (GetHostSourceContext() == Js::Constants::NoHostSourceContext
            && !m_isFuncRegisteredToDiag
            && !scriptContext->GetDebugContext()->GetProbeContainer()->IsContextRegistered(GetSecondaryHostSourceContext()))
        {
            FunctionBody *pFunc = scriptContext->GetDebugContext()->GetProbeContainer()->GetGlobalFunc(scriptContext, GetSecondaryHostSourceContext());
            if (pFunc)
            {
                // Existing behavior here is to ignore the OOM and since RegisterFuncToDiag
                // can throw now, we simply ignore the OOM here
                try
                {
                    // Register the function to the PDM as eval code (the debugger app will show file as 'eval code')
                    pFunc->RegisterFuncToDiag(scriptContext, Constants::EvalCode);
                }
                catch (Js::OutOfMemoryException)
                {
                }

                scriptContext->GetDebugContext()->GetProbeContainer()->RegisterContextToDiag(GetSecondaryHostSourceContext(), scriptContext->AllocatorForDiagnostics());

                m_isFuncRegisteredToDiag = true;
            }
        }
        else
        {
            m_isFuncRegisteredToDiag = true;
        }

    }